

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
::CreateVariadicMatcher<std::__cxx11::string_const&,1ul>
          (VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
           *this,vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
                 *values)

{
  testing *this_00;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *polymorphic_matcher_or_value;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  *local_20;
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  *values_local;
  VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  local_20 = values;
  values_local = (vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
                  *)this;
  this_00 = (testing *)
            std::
            get<1ul,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
                      ((tuple<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)this);
  SafeMatcherCast<std::__cxx11::string_const&,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_38,this_00,polymorphic_matcher_or_value);
  std::
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ::push_back(values,&local_38);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_38);
  CreateVariadicMatcher<std::__cxx11::string_const&,2ul>(this,local_20);
  return;
}

Assistant:

void CreateVariadicMatcher(std::vector<Matcher<T>>* values,
                             std::integral_constant<size_t, I>) const {
    values->push_back(SafeMatcherCast<T>(std::get<I>(matchers_)));
    CreateVariadicMatcher<T>(values, std::integral_constant<size_t, I + 1>());
  }